

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O2

iterator __thiscall
OpenMD::SectionParserManager::findSectionParser(SectionParserManager *this,string *sectionName)

{
  __type_conflict _Var1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)&this->sectionParsers_;
  do {
    p_Var2 = p_Var2->_M_next;
    if (p_Var2 == (_List_node_base *)&this->sectionParsers_) {
      return (iterator)p_Var2;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(p_Var2[1]._M_prev)->_M_prev,sectionName);
  } while (!_Var1);
  return (iterator)p_Var2;
}

Assistant:

SectionParserManager::iterator SectionParserManager::findSectionParser(
      const std::string& sectionName) {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->sectionParser->getSectionName() == sectionName) { break; }
    }
    return i;
  }